

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O3

int stmm_delete_int(stmm_table *table,long *keyp,char **value)

{
  char *pcVar1;
  stmm_hash_func_type p_Var2;
  stmm_compare_func_type p_Var3;
  stmm_table_entry **ppsVar4;
  int iVar5;
  int iVar6;
  stmm_table_entry **ppsVar7;
  stmm_table_entry *pEntry;
  
  pcVar1 = (char *)*keyp;
  p_Var2 = table->hash;
  if (p_Var2 == stmm_ptrhash) {
    iVar5 = (int)(((ulong)pcVar1 >> 2) % (ulong)(long)table->num_bins);
  }
  else if (p_Var2 == stmm_numhash) {
    iVar6 = (int)pcVar1;
    iVar5 = -iVar6;
    if (0 < iVar6) {
      iVar5 = iVar6;
    }
    iVar5 = iVar5 % table->num_bins;
  }
  else {
    iVar5 = (*p_Var2)(pcVar1,table->num_bins);
  }
  pEntry = table->bins[iVar5];
  if (pEntry != (stmm_table_entry *)0x0) {
    ppsVar7 = table->bins + iVar5;
    do {
      p_Var3 = table->compare;
      if (p_Var3 == stmm_numcmp || p_Var3 == stmm_ptrcmp) {
        if (pEntry->key == pcVar1) {
LAB_00410258:
          if (table->reorder_flag != 0) {
            *ppsVar7 = pEntry->next;
            ppsVar4 = table->bins;
            pEntry->next = ppsVar4[iVar5];
            ppsVar4[iVar5] = pEntry;
          }
          *ppsVar7 = pEntry->next;
          if (value != (char **)0x0) {
            *value = pEntry->record;
          }
          *keyp = (long)pEntry->key;
          Extra_MmFixedEntryRecycle((Extra_MmFixed_t *)table->pMemMan,(char *)pEntry);
          table->num_entries = table->num_entries + -1;
          return 1;
        }
      }
      else {
        iVar6 = (*p_Var3)(pcVar1,pEntry->key);
        if (iVar6 == 0) goto LAB_00410258;
      }
      ppsVar4 = &pEntry->next;
      ppsVar7 = &pEntry->next;
      pEntry = *ppsVar4;
    } while (*ppsVar4 != (stmm_table_entry *)0x0);
  }
  return 0;
}

Assistant:

int
stmm_delete_int (stmm_table *table, long *keyp, char **value)
{
    int hash_val;
    char *key = (char *) *keyp;
    stmm_table_entry *ptr, **last;

    hash_val = do_hash (key, table);

    FIND_ENTRY (table, hash_val, key, ptr, last);

    if (ptr == NULL) {
    return 0;
    }

    *last = ptr->next;
    if (value != NULL)
     *value = ptr->record;
    *keyp = (long) ptr->key;
//      ABC_FREE( ptr );
    Extra_MmFixedEntryRecycle ((Extra_MmFixed_t *)table->pMemMan, (char *) ptr);

    table->num_entries--;
    return 1;
}